

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_toradix(mp_int *a,char *str,int radix)

{
  int iVar1;
  long lVar2;
  mp_int t;
  mp_digit d;
  
  if (radix - 0x41U < 0xffffffc1) {
    iVar1 = -3;
  }
  else {
    if (a->used == 0) {
      str[0] = '0';
      str[1] = '\0';
    }
    else {
      iVar1 = mp_init_copy(&t,a);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (t.sign == 1) {
        *str = '-';
        str = str + 1;
        t.sign = 0;
      }
      lVar2 = 0;
      while (t.used != 0) {
        iVar1 = mp_div_d(&t,(ulong)(uint)radix,&t,&d);
        if (iVar1 != 0) {
          mp_clear(&t);
          return iVar1;
        }
        ((uchar *)str)[lVar2] = mp_s_rmap[d];
        lVar2 = lVar2 + 1;
      }
      bn_reverse((uchar *)str,(int)lVar2);
      ((uchar *)str)[lVar2] = '\0';
      mp_clear(&t);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mp_toradix (mp_int * a, char *str, int radix)
{
  int     res, digs;
  mp_int  t;
  mp_digit d;
  char   *_s = str;

  /* check range of the radix */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* quick out if its zero */
  if (mp_iszero(a) == 1) {
     *str++ = '0';
     *str = '\0';
     return MP_OKAY;
  }

  if ((res = mp_init_copy (&t, a)) != MP_OKAY) {
    return res;
  }

  /* if it is negative output a - */
  if (t.sign == MP_NEG) {
    ++_s;
    *str++ = '-';
    t.sign = MP_ZPOS;
  }

  digs = 0;
  while (mp_iszero (&t) == 0) {
    if ((res = mp_div_d (&t, (mp_digit) radix, &t, &d)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
    *str++ = mp_s_rmap[d];
    ++digs;
  }

  /* reverse the digits of the string.  In this case _s points
   * to the first digit [exluding the sign] of the number]
   */
  bn_reverse ((unsigned char *)_s, digs);

  /* append a NULL so the string is properly terminated */
  *str = '\0';

  mp_clear (&t);
  return MP_OKAY;
}